

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldd2bdd.c
# Opt level: O3

void run_WRAP(WorkerP *w,Task *__dq_head,TD_run *t)

{
  uint32_t uVar1;
  MDD MVar2;
  rel_t prVar3;
  char *__s;
  uint uVar4;
  double dVar5;
  undefined1 *puVar6;
  FILE *pFVar7;
  undefined8 uVar8;
  undefined8 lddmc;
  FILE *pFVar9;
  size_t sVar10;
  void *__ptr;
  size_t sVar11;
  MTBDD MVar12;
  int iVar13;
  rel_t prVar14;
  int *piVar15;
  int *piVar16;
  uint uVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  ulong uVar21;
  ulong uVar22;
  ulong __n;
  int *__ptr_00;
  undefined8 uStack_f0;
  int aiStack_e8 [2];
  undefined1 auStack_e0 [24];
  _func_void__WorkerP_ptr__Task_ptr__Task_ptr *p_Stack_c8;
  int *piStack_c0;
  MTBDD MStack_b8;
  undefined1 *puStack_b0;
  FILE *pFStack_a8;
  undefined1 auStack_a0 [28];
  int iStack_84;
  uint uStack_80;
  uint uStack_7c;
  undefined1 auStack_78 [8];
  undefined1 auStack_70 [24];
  FILE *pFStack_58;
  undefined8 uStack_50;
  MDD MStack_48;
  
  piVar16 = aiStack_e8;
  __ptr_00 = aiStack_e8;
  uStack_f0 = 0x105319;
  pFVar9 = fopen(model_filename,"rb");
  piVar15 = aiStack_e8;
  if (pFVar9 == (FILE *)0x0) goto LAB_00106051;
  uStack_f0 = 0x10533e;
  sVar10 = fread(&vector_size,4,1,pFVar9);
  piVar15 = aiStack_e8;
  if (sVar10 != 1) goto LAB_00106056;
  if (verbose == '\x01') {
    uStack_f0 = 0x10535d;
    puts("Loading initial state.");
  }
  auStack_70._0_8_ = set_load_WRAP;
  auStack_70._8_8_ = (_Worker *)0x1;
  uStack_f0 = 0x10537f;
  auStack_70._16_8_ = pFVar9;
  lace_run_task((Task *)auStack_70);
  auStack_a0._16_8_ = auStack_70._16_8_;
  uStack_f0 = 0x1053a3;
  sVar10 = fread(&next_count,4,1,pFVar9);
  iVar13 = next_count;
  piVar15 = aiStack_e8;
  if (sVar10 != 1) goto LAB_0010605b;
  uStack_f0 = 0x1053c0;
  next = (rel_t *)malloc((long)next_count << 3);
  if (verbose == '\x01') {
    uStack_f0 = 0x1053dc;
    puts("Loading transition relations.");
    iVar13 = next_count;
  }
  if (0 < iVar13) {
    lVar19 = 0;
    do {
      auStack_70._0_8_ = rel_load_proj_WRAP;
      auStack_70._8_8_ = (_Worker *)0x1;
      uStack_f0 = 0x105412;
      auStack_70._16_8_ = pFVar9;
      lace_run_task((Task *)auStack_70);
      next[lVar19] = (rel_t)auStack_70._16_8_;
      lVar19 = lVar19 + 1;
    } while (lVar19 < next_count);
    if (0 < next_count) {
      lVar19 = 0;
      do {
        pFStack_58 = (FILE *)next[lVar19];
        auStack_70._0_8_ = rel_load_WRAP;
        auStack_70._8_8_ = (_Worker *)0x1;
        uStack_f0 = 0x105469;
        auStack_70._16_8_ = pFVar9;
        lace_run_task((Task *)auStack_70);
        lVar19 = lVar19 + 1;
      } while (lVar19 < next_count);
    }
  }
  iStack_84 = 0;
  uStack_f0 = 0x105494;
  sVar10 = fread(&iStack_84,4,1,pFVar9);
  if (sVar10 != 1) goto LAB_00106060;
  piVar15 = aiStack_e8;
  if (iStack_84 == 0) goto LAB_00106065;
  if (verbose == '\x01') {
    uStack_f0 = 0x1054bd;
    puts("Loading reachable states.");
  }
  auStack_70._0_8_ = set_load_WRAP;
  auStack_70._8_8_ = (_Worker *)0x1;
  uStack_f0 = 0x1054d8;
  auStack_70._16_8_ = pFVar9;
  lace_run_task((Task *)auStack_70);
  pFStack_a8 = (FILE *)auStack_70._16_8_;
  uStack_80 = 0;
  uStack_f0 = 0x1054ff;
  sVar10 = fread(&uStack_80,4,1,pFVar9);
  if (sVar10 == 1) {
    uVar22 = (ulong)uStack_80;
    lVar19 = -(uVar22 * 8 + 0xf & 0xfffffffffffffff0);
    __ptr_00 = (int *)((long)aiStack_e8 + lVar19);
    piStack_c0 = aiStack_e8;
    puStack_b0 = (undefined1 *)__ptr_00;
    if (0 < (int)uStack_80) {
      uVar21 = 0;
      piStack_c0 = aiStack_e8;
      do {
        *(undefined8 *)((long)aiStack_e8 + lVar19 + -8) = 0x105555;
        sVar10 = fread(auStack_70,4,1,pFVar9);
        if (sVar10 != 1) {
LAB_00106047:
          *(undefined8 *)((long)aiStack_e8 + lVar19 + -8) = 0x10604c;
          run_CALL_cold_4();
          goto LAB_0010604c;
        }
        __n = auStack_70._0_8_ & 0xffffffff;
        uVar17 = auStack_70._0_4_ + 1;
        *(undefined8 *)((long)aiStack_e8 + lVar19 + -8) = 0x10556c;
        __ptr = malloc((ulong)uVar17);
        *(void **)(puStack_b0 + uVar21 * 8) = __ptr;
        *(undefined8 *)((long)aiStack_e8 + lVar19 + -8) = 0x10558d;
        sVar10 = fread(__ptr,1,__n,pFVar9);
        if (sVar10 != __n) {
          *(undefined8 *)((long)aiStack_e8 + lVar19 + -8) = 0x106047;
          run_CALL_cold_5();
          goto LAB_00106047;
        }
        *(undefined1 *)((long)__ptr + __n) = 0;
        uVar21 = uVar21 + 1;
      } while (uVar22 != uVar21);
    }
  }
  else {
    uStack_80 = 0;
    puStack_b0 = auStack_78;
    piStack_c0 = aiStack_e8;
  }
  *(undefined8 *)((long)__ptr_00 + -8) = 0x1055c6;
  fclose(pFVar9);
  *(undefined8 *)((long)__ptr_00 + -8) = 0x1055db;
  printf("Read file %s.\n");
  if (verbose != '\0') {
    *(undefined8 *)((long)__ptr_00 + -8) = 0x105602;
    printf("%d integers per state, %d transition groups\n",(ulong)(uint)vector_size,
           (ulong)(uint)next_count);
    *(undefined8 *)((long)__ptr_00 + -8) = 0x10560e;
    puts("LDD nodes:");
    MVar2 = *(MDD *)auStack_a0._16_8_;
    *(undefined8 *)((long)__ptr_00 + -8) = 0x10561d;
    lddmc_nodecount(MVar2);
    *(undefined8 *)((long)__ptr_00 + -8) = 0x10562e;
    printf("Initial states: %zu LDD nodes\n");
    if (0 < next_count) {
      uVar22 = 0;
      do {
        MVar2 = next[uVar22]->dd;
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105654;
        sVar11 = lddmc_nodecount(MVar2);
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105664;
        printf("Transition %d: %zu LDD nodes\n",uVar22 & 0xffffffff,sVar11);
        uVar22 = uVar22 + 1;
      } while ((long)uVar22 < (long)next_count);
    }
    if (verbose == '\x01') {
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105688;
      puts("Preparing conversion to BDD...");
    }
  }
  prVar14 = (rel_t)((long)__ptr_00 + -((ulong)(uint)vector_size * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    prVar14[-1].w_proj = (int *)0x1056b5;
    memset(prVar14,0,(ulong)(uint)vector_size << 2);
  }
  auStack_70._16_8_ = *(undefined8 *)pFStack_a8;
  auStack_70._0_8_ = compute_highest_WRAP;
  auStack_70._8_8_ = (_Worker *)0x1;
  pFStack_58 = (FILE *)prVar14;
  prVar14[-1].w_proj = (int *)0x1056e2;
  lace_run_task((Task *)auStack_70);
  uStack_7c = 0;
  if (0 < next_count) {
    lVar19 = 0;
    do {
      auStack_70._16_8_ = next[lVar19]->dd;
      pFStack_58 = (FILE *)next[lVar19]->meta;
      auStack_70._0_8_ = compute_highest_action_WRAP;
      auStack_70._8_8_ = (_Worker *)0x1;
      uStack_50 = &uStack_7c;
      prVar14[-1].w_proj = (int *)0x10572e;
      lace_run_task((Task *)auStack_70);
      lVar19 = lVar19 + 1;
    } while (lVar19 < next_count);
  }
  uVar22 = (ulong)(uint)vector_size;
  __ptr_00 = (int *)((long)prVar14 - (uVar22 * 4 + 0xf & 0xfffffffffffffff0));
  if (0 < vector_size) {
    uVar21 = 0;
    do {
      uVar17 = *(uint *)((long)&prVar14->dd + uVar21 * 4);
      iVar13 = 0;
      if (uVar17 != 0) {
        uVar4 = 0x1f;
        if (uVar17 != 0) {
          for (; uVar17 >> uVar4 == 0; uVar4 = uVar4 - 1) {
          }
        }
        iVar13 = 0x20 - (uVar4 ^ 0x1f);
        iVar18 = (uVar4 ^ 0x1f) - 0x20;
        do {
          uVar17 = uVar17 >> 1;
          iVar18 = iVar18 + 1;
        } while (iVar18 != 0);
        *(uint *)((long)&prVar14->dd + uVar21 * 4) = uVar17;
      }
      *(uint *)((long)__ptr_00 + uVar21 * 4) = iVar13 + (uint)(iVar13 == 0);
      uVar21 = uVar21 + 1;
    } while (uVar21 != uVar22);
  }
  uVar17 = uStack_7c;
  actionbits = 0;
  if (uStack_7c != 0) {
    uVar4 = 0x1f;
    if (uStack_7c != 0) {
      for (; uStack_7c >> uVar4 == 0; uVar4 = uVar4 - 1) {
      }
    }
    actionbits = 0x20 - (uVar4 ^ 0x1f);
    iVar13 = (uVar4 ^ 0x1f) - 0x20;
    do {
      uStack_7c = uStack_7c >> 1;
      iVar13 = iVar13 + 1;
    } while (iVar13 != 0);
  }
  if ((uVar17 == 0) && ((has_actions & 1) != 0)) {
    actionbits = 1;
  }
  if (verbose == '\x01') {
    *(undefined8 *)((long)__ptr_00 + -8) = 0x1057f5;
    printf("Bits per level: ");
    if (0 < vector_size) {
      lVar19 = 0;
      do {
        if (lVar19 != 0) {
          *(undefined8 *)((long)__ptr_00 + -8) = 0x10581e;
          printf(", ");
        }
        uVar17 = *(uint *)((long)__ptr_00 + lVar19 * 4);
        *(undefined8 *)((long)__ptr_00 + -8) = 0x10582c;
        printf("%d",(ulong)uVar17);
        lVar19 = lVar19 + 1;
      } while (lVar19 < vector_size);
    }
    *(undefined8 *)((long)__ptr_00 + -8) = 0x105845;
    putchar(10);
    *(undefined8 *)((long)__ptr_00 + -8) = 0x105859;
    printf("Action bits: %d.\n",(ulong)(uint)actionbits);
    uVar22 = (ulong)(uint)vector_size;
  }
  prVar14 = (rel_t)0x1;
  if (0 < (int)uVar22) {
    iVar13 = 0;
    iVar18 = -1;
    do {
      uVar1 = *(uint32_t *)((long)__ptr_00 + (long)((int)uVar22 + iVar18) * 4);
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105880;
      prVar14 = (rel_t)lddmc_makenode(uVar1,(MDD)prVar14,0);
      iVar13 = iVar13 + 1;
      uVar22 = (ulong)(uint)vector_size;
      iVar18 = iVar18 + -1;
    } while (iVar13 < vector_size);
  }
  auStack_a0._8_8_ = prVar14;
  *(undefined8 *)((long)__ptr_00 + -8) = 0x1058ab;
  lddmc_ref((MDD)prVar14);
  if ((long)vector_size < 1) {
    MStack_b8 = 0x8000000000000000;
    iVar13 = 0;
  }
  else {
    lVar19 = 0;
    iVar13 = 0;
    do {
      iVar18 = iVar13;
      lVar20 = lVar19 * 4;
      iVar13 = *(int *)((long)__ptr_00 + lVar20) + iVar18;
      lVar19 = lVar19 + 1;
    } while (vector_size != lVar19);
    MStack_b8 = 0x8000000000000000;
    if (0 < iVar13) {
      iVar18 = *(int *)((long)__ptr_00 + lVar20) + iVar18;
      uVar1 = iVar18 * 2;
      do {
        MVar12 = MStack_b8;
        uVar1 = uVar1 - 2;
        if (MStack_b8 == 0) {
          MStack_b8 = 0;
        }
        else {
          *(undefined8 *)((long)__ptr_00 + -8) = 0x1058f7;
          MStack_b8 = _mtbdd_makenode(uVar1,0,MVar12);
        }
        iVar18 = iVar18 + -1;
      } while (iVar18 != 0);
    }
  }
  *(undefined8 *)((long)__ptr_00 + -8) = 0x105926;
  mtbdd_protect(&MStack_b8);
  if (verbose != '\0') {
    *(undefined8 *)((long)__ptr_00 + -8) = 0x10593b;
    puts("Converting to BDD...");
  }
  *(undefined8 *)((long)__ptr_00 + -8) = 0x10594e;
  pFVar9 = fopen(bdd_filename,"w");
  if (pFVar9 != (FILE *)0x0) {
    *(undefined8 *)((long)__ptr_00 + -8) = 0x105973;
    fwrite(&vector_size,4,1,pFVar9);
    *(undefined8 *)((long)__ptr_00 + -8) = 0x10598a;
    fwrite(__ptr_00,4,(long)vector_size,pFVar9);
    *(undefined8 *)((long)__ptr_00 + -8) = 0x1059a3;
    fwrite(&actionbits,4,1,pFVar9);
    auStack_70._16_8_ = *(undefined8 *)auStack_a0._16_8_;
    auStack_70._0_8_ = bdd_from_ldd_WRAP;
    auStack_70._8_8_ = (_Worker *)0x1;
    pFStack_58 = (FILE *)auStack_a0._8_8_;
    uStack_50 = (uint *)((ulong)uStack_50 & 0xffffffff00000000);
    *(undefined8 *)((long)__ptr_00 + -8) = 0x1059e7;
    lace_run_task((Task *)auStack_70);
    uVar8 = auStack_70._16_8_;
    p_Stack_c8 = (_func_void__WorkerP_ptr__Task_ptr__Task_ptr *)auStack_70._16_8_;
    auStack_e0._16_8_ = SEXT48(iVar13);
    auStack_70._0_8_ = mtbdd_satcount_WRAP;
    auStack_70._8_8_ = (_Worker *)0x1;
    pFStack_58 = (FILE *)auStack_e0._16_8_;
    *(undefined8 *)((long)__ptr_00 + -8) = 0x105a23;
    lace_run_task((Task *)auStack_70);
    uVar22 = (ulong)(double)auStack_70._16_8_;
    dVar5 = (double)auStack_70._16_8_ - 9.223372036854776e+18;
    auStack_70._16_8_ = *(undefined8 *)auStack_a0._16_8_;
    auStack_70._0_8_ = lddmc_satcount_cached_WRAP;
    auStack_70._8_8_ = (_Worker *)0x1;
    *(undefined8 *)((long)__ptr_00 + -8) = 0x105a74;
    lace_run_task((Task *)auStack_70);
    if (((long)uVar22 >> 0x3f & (long)dVar5 | uVar22) ==
        ((long)(double)auStack_70._16_8_ >> 0x3f &
         (long)((double)auStack_70._16_8_ - 9.223372036854776e+18) | (long)(double)auStack_70._16_8_
        )) {
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105aab;
      mtbdd_refs_push(uVar8);
      auStack_e0._0_4_ = 0xffffffff;
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105acd;
      fwrite(auStack_e0,4,1,pFVar9);
      auStack_70._0_8_ = mtbdd_writer_tobinary_WRAP;
      auStack_70._8_8_ = (_Worker *)0x1;
      pFStack_58 = (FILE *)&p_Stack_c8;
      uStack_50._0_1_ = '\x01';
      uStack_50._1_1_ = '\0';
      uStack_50._2_1_ = '\0';
      uStack_50._3_1_ = '\0';
      auStack_70._16_8_ = pFVar9;
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105b02;
      lace_run_task((Task *)auStack_70);
      pFVar7 = pFStack_a8;
      auStack_70._16_8_ = *(undefined8 *)pFStack_a8;
      auStack_70._0_8_ = bdd_from_ldd_WRAP;
      auStack_70._8_8_ = (_Worker *)0x1;
      pFStack_58 = (FILE *)auStack_a0._8_8_;
      uStack_50 = (uint *)((ulong)uStack_50._4_4_ << 0x20);
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105b3e;
      lace_run_task((Task *)auStack_70);
      uVar8 = auStack_70._16_8_;
      auStack_e0._0_8_ = auStack_70._16_8_;
      auStack_70._0_8_ = mtbdd_satcount_WRAP;
      auStack_70._8_8_ = (_Worker *)0x1;
      pFStack_58 = (FILE *)auStack_e0._16_8_;
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105b6e;
      lace_run_task((Task *)auStack_70);
      uVar22 = (ulong)(double)auStack_70._16_8_;
      dVar5 = (double)auStack_70._16_8_ - 9.223372036854776e+18;
      auStack_70._16_8_ = *(undefined8 *)pFVar7;
      auStack_70._0_8_ = lddmc_satcount_cached_WRAP;
      auStack_70._8_8_ = (_Worker *)0x1;
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105bb9;
      lace_run_task((Task *)auStack_70);
      if (((long)uVar22 >> 0x3f & (long)dVar5 | uVar22) !=
          ((long)(double)auStack_70._16_8_ >> 0x3f &
           (long)((double)auStack_70._16_8_ - 9.223372036854776e+18) |
          (long)(double)auStack_70._16_8_)) {
        *(code **)((long)__ptr_00 + -8) = main;
        __assert_fail("(size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                      ,0x2b2,"void run_WORK(WorkerP *, Task *)");
      }
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105bef;
      mtbdd_refs_push(uVar8);
      if (verbose == '\x01') {
        auStack_70._0_8_ = p_Stack_c8;
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105c0f;
        sVar11 = mtbdd_nodecount_more((MTBDD *)auStack_70,1);
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105c20;
        printf("Initial states: %zu BDD nodes\n",sVar11);
        auStack_70._0_8_ = uVar8;
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105c31;
        sVar11 = mtbdd_nodecount_more((MTBDD *)auStack_70,1);
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105c42;
        printf("Reachable states: %zu BDD nodes\n",sVar11);
      }
      auStack_a0._16_8_ = uVar8;
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105c62;
      fwrite(&next_count,4,1,pFVar9);
      prVar14 = (rel_t)auStack_a0._8_8_;
      if (0 < next_count) {
        lVar19 = 0;
        do {
          prVar3 = next[lVar19];
          *(undefined8 *)((long)__ptr_00 + -8) = 0x105c9a;
          fwrite(&prVar3->r_k,4,1,pFVar9);
          prVar3 = next[lVar19];
          *(undefined8 *)((long)__ptr_00 + -8) = 0x105cbb;
          fwrite(&prVar3->w_k,4,1,pFVar9);
          piVar15 = next[lVar19]->r_proj;
          iVar13 = next[lVar19]->r_k;
          *(undefined8 *)((long)__ptr_00 + -8) = 0x105cdb;
          fwrite(piVar15,4,(long)iVar13,pFVar9);
          piVar15 = next[lVar19]->w_proj;
          iVar13 = next[lVar19]->w_k;
          *(undefined8 *)((long)__ptr_00 + -8) = 0x105cfb;
          fwrite(piVar15,4,(long)iVar13,pFVar9);
          lVar19 = lVar19 + 1;
        } while (lVar19 < next_count);
        if (0 < next_count) {
          uVar22 = 0;
          auStack_e0._8_8_ = pFVar9;
          do {
            auStack_70._16_8_ = next[uVar22]->dd;
            MStack_48 = next[uVar22]->meta;
            auStack_70._0_8_ = bdd_from_ldd_rel_WRAP;
            auStack_70._8_8_ = (_Worker *)0x1;
            uStack_50 = (uint *)((ulong)uStack_50 & 0xffffffff00000000);
            pFStack_58 = (FILE *)prVar14;
            *(undefined8 *)((long)__ptr_00 + -8) = 0x105d64;
            lace_run_task((Task *)auStack_70);
            uVar8 = auStack_70._16_8_;
            auStack_a0._0_8_ = auStack_70._16_8_;
            *(undefined8 *)((long)__ptr_00 + -8) = 0x105d74;
            mtbdd_refs_push(uVar8);
            auStack_70._0_8_ = mtbdd_writer_tobinary_WRAP;
            auStack_70._8_8_ = (_Worker *)0x1;
            pFStack_58 = (FILE *)auStack_a0;
            uStack_50 = (uint *)CONCAT44(uStack_50._4_4_,1);
            auStack_70._16_8_ = pFVar9;
            *(undefined8 *)((long)__ptr_00 + -8) = 0x105da5;
            lace_run_task((Task *)auStack_70);
            if (verbose == '\x01') {
              auStack_70._0_8_ = auStack_a0._0_8_;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105dc6;
              sVar11 = mtbdd_nodecount_more((MTBDD *)auStack_70,1);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105dda;
              printf("Transition %d: %zu BDD nodes\n",uVar22 & 0xffffffff,sVar11);
            }
            if (check_results == '\x01') {
              MVar2 = next[uVar22]->meta;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105e00;
              MVar12 = meta_to_bdd(MVar2,(MDD)prVar14,0);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105e0e;
              mtbdd_refs_push(MVar12);
              auStack_70._0_8_ = sylvan_relnext_WRAP;
              auStack_70._8_8_ = (_Worker *)0x1;
              auStack_70._16_8_ = auStack_a0._16_8_;
              pFStack_58 = (FILE *)auStack_a0._0_8_;
              MStack_48 = MStack_48 & 0xffffffff00000000;
              uStack_50 = (uint *)MVar12;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105e4a;
              lace_run_task((Task *)auStack_70);
              uVar8 = auStack_70._16_8_;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105e56;
              mtbdd_refs_push(uVar8);
              auStack_70._16_8_ = *(undefined8 *)pFStack_a8;
              pFStack_58 = (FILE *)next[uVar22]->dd;
              uStack_50 = (uint *)next[uVar22]->meta;
              auStack_70._0_8_ = lddmc_relprod_WRAP;
              auStack_70._8_8_ = (_Worker *)0x1;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105e93;
              lace_run_task((Task *)auStack_70);
              lddmc = auStack_70._16_8_;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105e9f;
              lddmc_refs_push(lddmc);
              prVar14 = (rel_t)auStack_a0._8_8_;
              auStack_70._0_8_ = bdd_from_ldd_WRAP;
              auStack_70._8_8_ = (_Worker *)0x1;
              pFStack_58 = (FILE *)auStack_a0._8_8_;
              uStack_50 = (uint *)((ulong)uStack_50 & 0xffffffff00000000);
              auStack_70._16_8_ = lddmc;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105ed0;
              lace_run_task((Task *)auStack_70);
              if (uVar8 != auStack_70._16_8_) goto LAB_0010604c;
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105ee4;
              lddmc_refs_pop(1);
              *(undefined8 *)((long)__ptr_00 + -8) = 0x105eee;
              mtbdd_refs_pop(2);
              pFVar9 = (FILE *)auStack_e0._8_8_;
            }
            *(undefined8 *)((long)__ptr_00 + -8) = 0x105f09;
            mtbdd_refs_pop(1);
            uVar22 = uVar22 + 1;
          } while ((long)uVar22 < (long)next_count);
        }
      }
      if (no_reachable != '\0') {
        iStack_84 = 0;
      }
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105f45;
      fwrite(&iStack_84,4,1,pFVar9);
      if (iStack_84 != 0) {
        auStack_a0._0_4_ = 0xffffffff;
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105f69;
        fwrite(auStack_a0,4,1,pFVar9);
        auStack_70._0_8_ = mtbdd_writer_tobinary_WRAP;
        auStack_70._8_8_ = (_Worker *)0x1;
        pFStack_58 = (FILE *)auStack_e0;
        uStack_50 = (uint *)CONCAT44(uStack_50._4_4_,1);
        auStack_70._16_8_ = pFVar9;
        *(undefined8 *)((long)__ptr_00 + -8) = 0x105f9a;
        lace_run_task((Task *)auStack_70);
      }
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105fa4;
      mtbdd_refs_pop(1);
      *(undefined8 *)((long)__ptr_00 + -8) = 0x105fbd;
      fwrite(&uStack_80,4,1,pFVar9);
      puVar6 = puStack_b0;
      lVar19 = (long)(int)uStack_80;
      if (0 < lVar19) {
        lVar20 = 0;
        do {
          __s = *(char **)(puVar6 + lVar20 * 8);
          *(undefined8 *)((long)__ptr_00 + -8) = 0x105fdb;
          sVar10 = strlen(__s);
          auStack_70._0_4_ = (int)sVar10;
          *(undefined8 *)((long)__ptr_00 + -8) = 0x105ff4;
          fwrite(auStack_70,4,1,pFVar9);
          uVar22 = auStack_70._0_8_ & 0xffffffff;
          *(undefined8 *)((long)__ptr_00 + -8) = 0x106007;
          fwrite(__s,1,uVar22,pFVar9);
          lVar20 = lVar20 + 1;
        } while (lVar19 != lVar20);
      }
      *(undefined8 *)((long)__ptr_00 + -8) = 0x106017;
      fclose(pFVar9);
      *(undefined8 *)((long)__ptr_00 + -8) = 0x10602c;
      printf("Written file %s.\n",bdd_filename);
      return;
    }
    goto LAB_0010606f;
  }
  goto LAB_0010606a;
LAB_0010604c:
  *(undefined8 *)((long)__ptr_00 + -8) = 0x106051;
  run_CALL_cold_6();
  piVar15 = __ptr_00;
LAB_00106051:
  *(undefined8 *)((long)piVar15 + -8) = 0x106056;
  run_CALL_cold_9();
LAB_00106056:
  *(undefined8 *)((long)piVar15 + -8) = 0x10605b;
  run_CALL_cold_1();
LAB_0010605b:
  piVar16 = piVar15;
  *(undefined8 *)((long)piVar16 + -8) = 0x106060;
  run_CALL_cold_2();
LAB_00106060:
  *(undefined8 *)((long)piVar16 + -8) = 0x106065;
  run_CALL_cold_3();
  piVar15 = piVar16;
LAB_00106065:
  __ptr_00 = piVar15;
  *(undefined8 *)((long)__ptr_00 + -8) = 0x10606a;
  run_CALL_cold_8();
LAB_0010606a:
  *(undefined8 *)((long)__ptr_00 + -8) = 0x10606f;
  run_CALL_cold_7();
LAB_0010606f:
  *(undefined8 *)((long)__ptr_00 + -8) = 0x10608e;
  __assert_fail("(size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/examples/ldd2bdd.c"
                ,0x2a8,"void run_WORK(WorkerP *, Task *)");
}

Assistant:

VOID_TASK_0(run)
{
    // Open file
    FILE *f = fopen(model_filename, "rb");
    if (f == NULL) Abort("Cannot open file '%s'!\n", model_filename);

    // Read integers per vector
    if (fread(&vector_size, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");

    // Read initial state
    if (verbose) printf("Loading initial state.\n");
    set_t initial = set_load(f);

    // Read number of transitions
    if (fread(&next_count, sizeof(int), 1, f) != 1) Abort("Invalid input file!\n");
    next = (rel_t*)malloc(sizeof(rel_t) * next_count);

    // Read transitions
    if (verbose) printf("Loading transition relations.\n");
    for (int i=0; i<next_count; i++) next[i] = rel_load_proj(f);
    for (int i=0; i<next_count; i++) rel_load(f, next[i]);

    // Read whether reachable states are stored
    int has_reachable = 0;
    if (fread(&has_reachable, sizeof(int), 1, f) != 1) Abort("Input file missing reachable states!\n");
    if (has_reachable == 0) Abort("Input file missing reachable states!\n");

    // Read reachable states
    if (verbose) printf("Loading reachable states.\n");
    set_t states = set_load(f);
    
    // Read number of action labels
    int action_labels_count = 0;
    if (fread(&action_labels_count, sizeof(int), 1, f) != 1) action_labels_count = 0;
    // ignore: Abort("Input file missing action label count!\n");

    // Read action labels
    char *action_labels[action_labels_count];
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len;
        if (fread(&len, sizeof(uint32_t), 1, f) != 1) Abort("Invalid input file!\n");
        action_labels[i] = (char*)malloc(sizeof(char[len+1]));
        if (fread(action_labels[i], sizeof(char), len, f) != len) Abort("Invalid input file!\n");
        action_labels[i][len] = 0;
    }

    // Close file
    fclose(f);

    // Report that we have read the input file
    printf("Read file %s.\n", model_filename);

    // Report statistics
    if (verbose) {
        printf("%d integers per state, %d transition groups\n", vector_size, next_count);
        printf("LDD nodes:\n");
        printf("Initial states: %zu LDD nodes\n", lddmc_nodecount(initial->dd));
        for (int i=0; i<next_count; i++) {
            printf("Transition %d: %zu LDD nodes\n", i, lddmc_nodecount(next[i]->dd));
        }
    }

    // Report that we prepare BDD conversion
    if (verbose) printf("Preparing conversion to BDD...\n");

    // Compute highest value at each level (from reachable states)
    uint32_t highest[vector_size];
    for (int i=0; i<vector_size; i++) highest[i] = 0;
    compute_highest(states->dd, highest);

    // Compute highest action label value (from transition relations)
    uint32_t highest_action = 0;
    for (int i=0; i<next_count; i++) {
        compute_highest_action(next[i]->dd, next[i]->meta, &highest_action);
    }

    // Compute number of bits for each level
    int bits[vector_size];
    for (int i=0; i<vector_size; i++) {
        bits[i] = 0;
        while (highest[i] != 0) {
            bits[i]++;
            highest[i]>>=1;
        }
        if (bits[i] == 0) bits[i] = 1;
    }

    // Compute number of bits for action label
    actionbits = 0;
    while (highest_action != 0) {
        actionbits++;
        highest_action>>=1;
    }
    if (actionbits == 0 && has_actions) actionbits = 1;

    // Report number of bits
    if (verbose) {
        printf("Bits per level: ");
        for (int i=0; i<vector_size; i++) {
            if (i>0) printf(", ");
            printf("%d", bits[i]);
        }
        printf("\n");
        printf("Action bits: %d.\n", actionbits);
    }

    // Compute bits MDD
    MDD bits_dd = lddmc_true;
    for (int i=0; i<vector_size; i++) {
        bits_dd = lddmc_makenode(bits[vector_size-i-1], bits_dd, lddmc_false);
    }
    lddmc_ref(bits_dd);

    // Compute total number of bits
    int totalbits = 0;
    for (int i=0; i<vector_size; i++) {
        totalbits += bits[i];
    }

    // Compute state variables
    MTBDD state_vars = mtbdd_true;
    for (int i=0; i<totalbits; i++) {
        state_vars = mtbdd_makenode(2*(totalbits-i-1), mtbdd_false, state_vars);
    }
    mtbdd_protect(&state_vars);

    // Report that we begin the actual conversion
    if (verbose) printf("Converting to BDD...\n");

    // Create BDD file
    f = fopen(bdd_filename, "w");
    if (f == NULL) Abort("Cannot open file '%s'!\n", bdd_filename);

    // Write domain...
    fwrite(&vector_size, sizeof(int), 1, f);
    fwrite(bits, sizeof(int), vector_size, f);
    fwrite(&actionbits, sizeof(int), 1, f);

    // Write initial state...
    MTBDD new_initial = bdd_from_ldd(initial->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_initial, totalbits) == (size_t)lddmc_satcount_cached(initial->dd));
    mtbdd_refs_push(new_initial);
    {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_initial, 1);
    }

    // Custom operation that converts to BDD given number of bits for each level
    MTBDD new_states = bdd_from_ldd(states->dd, bits_dd, 0);
    assert((size_t)mtbdd_satcount(new_states, totalbits) == (size_t)lddmc_satcount_cached(states->dd));
    mtbdd_refs_push(new_states);

    // Report size of BDD
    if (verbose) {
        printf("Initial states: %zu BDD nodes\n", mtbdd_nodecount(new_initial));
        printf("Reachable states: %zu BDD nodes\n", mtbdd_nodecount(new_states));
    }

    // Write number of transitions
    fwrite(&next_count, sizeof(int), 1, f);

    // Write meta for each transition
    for (int i=0; i<next_count; i++) {
        fwrite(&next[i]->r_k, sizeof(int), 1, f);
        fwrite(&next[i]->w_k, sizeof(int), 1, f);
        fwrite(next[i]->r_proj, sizeof(int), next[i]->r_k, f);
        fwrite(next[i]->w_proj, sizeof(int), next[i]->w_k, f);
    }

    // Write BDD for each transition
    for (int i=0; i<next_count; i++) {
        // Compute new transition relation
        MTBDD new_rel = bdd_from_ldd_rel(next[i]->dd, bits_dd, 0, next[i]->meta);
        mtbdd_refs_push(new_rel);
        mtbdd_writer_tobinary(f, &new_rel, 1);

        // Report number of nodes
        if (verbose) printf("Transition %d: %zu BDD nodes\n", i, mtbdd_nodecount(new_rel));

        if (check_results) {
            // Compute new <variables> for the current transition relation
            MTBDD new_vars = meta_to_bdd(next[i]->meta, bits_dd, 0);
            mtbdd_refs_push(new_vars);

            // Test if the transition is correctly converted
            MTBDD test = sylvan_relnext(new_states, new_rel, new_vars);
            mtbdd_refs_push(test);
            MDD succ = lddmc_relprod(states->dd, next[i]->dd, next[i]->meta);
            lddmc_refs_push(succ);
            MTBDD test2 = bdd_from_ldd(succ, bits_dd, 0);
            if (test != test2) Abort("Conversion error!\n");
            lddmc_refs_pop(1);
            mtbdd_refs_pop(2);
        }

        mtbdd_refs_pop(1);
    }

    // Write reachable states
    if (no_reachable) has_reachable = 0;
    fwrite(&has_reachable, sizeof(int), 1, f);
    if (has_reachable) {
        int k = -1;
        fwrite(&k, sizeof(int), 1, f);
        mtbdd_writer_tobinary(f, &new_states, 1);
    }
    mtbdd_refs_pop(1);  // new_states

    // Write action labels
    fwrite(&action_labels_count, sizeof(int), 1, f);
    for (int i=0; i<action_labels_count; i++) {
        uint32_t len = strlen(action_labels[i]);
        fwrite(&len, sizeof(uint32_t), 1, f);
        fwrite(action_labels[i], sizeof(char), len, f);
    }

    // Close the file
    fclose(f);

    // Report to the user
    printf("Written file %s.\n", bdd_filename);
}